

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unroller.cpp
# Opt level: O0

void __thiscall
spvtools::opt::anon_unknown_0::LoopUnrollerUtilsImpl::AddBlocksToFunction
          (LoopUnrollerUtilsImpl *this,BasicBlock *insert_point)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  pointer this_00;
  iterator local_38;
  undefined1 local_28 [8];
  iterator basic_block_iterator;
  BasicBlock *insert_point_local;
  LoopUnrollerUtilsImpl *this_local;
  
  basic_block_iterator.iterator_._M_current =
       (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *)
       insert_point;
  _local_28 = Function::begin(this->function_);
  while( true ) {
    local_38 = Function::end(this->function_);
    bVar1 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator!=
                      ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_28,&local_38);
    if (!bVar1) {
      __assert_fail("false && \"Could not add basic blocks to function as insert point was not found.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_unroller.cpp"
                    ,0x358,
                    "void spvtools::opt::(anonymous namespace)::LoopUnrollerUtilsImpl::AddBlocksToFunction(const BasicBlock *)"
                   );
    }
    this_00 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator->
                        ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_28);
    uVar2 = BasicBlock::id(this_00);
    uVar3 = BasicBlock::id((BasicBlock *)basic_block_iterator.iterator_._M_current);
    if (uVar2 == uVar3) break;
    UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator++
              ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_28);
  }
  UptrVectorIterator<spvtools::opt::BasicBlock,_false>::InsertBefore<false>
            ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_28,&this->blocks_to_add_)
  ;
  return;
}

Assistant:

void LoopUnrollerUtilsImpl::AddBlocksToFunction(
    const BasicBlock* insert_point) {
  for (auto basic_block_iterator = function_.begin();
       basic_block_iterator != function_.end(); ++basic_block_iterator) {
    if (basic_block_iterator->id() == insert_point->id()) {
      basic_block_iterator.InsertBefore(&blocks_to_add_);
      return;
    }
  }

  assert(
      false &&
      "Could not add basic blocks to function as insert point was not found.");
}